

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_color.cxx
# Opt level: O0

void Fl::free_color(Fl_Color i,int overlay)

{
  Colormap colormap;
  int overlay_local;
  Fl_Color i_local;
  
  if ((overlay == 0) && (fl_xmap[0][i].mapped != '\0')) {
    if (fl_xmap[0][i].mapped == '\x01') {
      XFreeColors(fl_display,fl_colormap,(ulong)i * 0x10 + 0x3169b8,1,0);
    }
    fl_xmap[0][i].mapped = '\0';
  }
  return;
}

Assistant:

void Fl::free_color(Fl_Color i, int overlay) {
#  if HAVE_OVERLAY
#  else
  if (overlay) return;
#  endif
  if (fl_xmap[overlay][i].mapped) {
#  if USE_COLORMAP
#    if HAVE_OVERLAY
    Colormap colormap = overlay ? fl_overlay_colormap : fl_colormap;
#    else
    Colormap colormap = fl_colormap;
#    endif
    if (fl_xmap[overlay][i].mapped == 1)
      XFreeColors(fl_display, colormap, &(fl_xmap[overlay][i].pixel), 1, 0);
#  endif
    fl_xmap[overlay][i].mapped = 0;
  }
}